

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_wrap.c
# Opt level: O3

int aes_crypt_xts_wrap(void *ctx,mbedtls_operation_t operation,size_t length,uchar *data_unit,
                      uchar *input,uchar *output)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  mbedtls_aes_xts_context *xts_ctx;
  uint *puVar7;
  uint uVar8;
  ulong uVar9;
  uint *puVar10;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  mbedtls_aes_context *pmStack_60;
  uint uStack_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  uint auStack_48 [6];
  
  if (1 < (uint)operation) {
    return -0x6100;
  }
  iVar3 = -0x22;
  if ((0xffffffffff00000e < length - 0x1000001) &&
     (iVar3 = mbedtls_aes_crypt_ecb
                        ((mbedtls_aes_context *)((long)ctx + 0x120),1,data_unit,(uchar *)&uStack_58)
     , iVar3 == 0)) {
    uVar8 = (uint)length & 0xf;
    uVar9 = (ulong)uVar8;
    uVar6 = length >> 4;
    pmStack_60 = (mbedtls_aes_context *)ctx;
    do {
      puVar7 = (uint *)output;
      uVar6 = uVar6 - 1;
      if (uVar6 == 0 && (operation == MBEDTLS_DECRYPT && uVar9 != 0)) {
        mbedtls_gf128mul_x_ble((uchar *)&uStack_58,(uchar *)&uStack_58);
      }
      uStack_78 = *(uint *)input ^ uStack_58;
      uStack_74 = *(uint *)((long)input + 4) ^ uStack_54;
      uStack_70 = *(uint *)((long)input + 8) ^ uStack_50;
      uStack_6c = *(uint *)((long)input + 0xc) ^ uStack_4c;
      iVar3 = mbedtls_aes_crypt_ecb(pmStack_60,operation,(uchar *)&uStack_78,(uchar *)&uStack_78);
      if (iVar3 != 0) {
        return iVar3;
      }
      *puVar7 = uStack_58 ^ uStack_78;
      puVar7[1] = uStack_54 ^ uStack_74;
      puVar7[2] = uStack_50 ^ uStack_70;
      puVar7[3] = uStack_4c ^ uStack_6c;
      mbedtls_gf128mul_x_ble((uchar *)&uStack_58,(uchar *)&uStack_58);
      input = (uchar *)((long)input + 0x10);
      output = (uchar *)(puVar7 + 4);
    } while (uVar6 != 0);
    if (uVar9 != 0) {
      puVar10 = &uStack_58;
      if (operation == MBEDTLS_DECRYPT) {
        puVar10 = auStack_48;
      }
      uVar6 = 0;
      do {
        uVar5 = uVar6;
        *(uchar *)((long)(puVar7 + 4) + uVar5) = *(uchar *)((long)puVar7 + uVar5);
        *(byte *)((long)&uStack_78 + uVar5) =
             *(byte *)((long)puVar10 + uVar5) ^ *(byte *)((long)input + uVar5);
        uVar6 = uVar5 + 1;
      } while (uVar9 != uVar6);
      if (uVar5 < 0xf) {
        lVar4 = (uVar6 - uVar8 * 2) + 0x10;
        do {
          *(byte *)((long)&uStack_78 + uVar9) =
               *(byte *)((long)puVar10 + uVar9) ^ *(byte *)((long)puVar7 + uVar9);
          uVar9 = uVar9 + 1;
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
      }
      iVar3 = mbedtls_aes_crypt_ecb(pmStack_60,operation,(uchar *)&uStack_78,(uchar *)&uStack_78);
      if (iVar3 != 0) {
        return iVar3;
      }
      uVar8 = puVar10[1];
      uVar1 = puVar10[2];
      uVar2 = puVar10[3];
      *puVar7 = *puVar10 ^ uStack_78;
      puVar7[1] = uVar8 ^ uStack_74;
      puVar7[2] = uVar1 ^ uStack_70;
      puVar7[3] = uVar2 ^ uStack_6c;
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int aes_crypt_xts_wrap( void *ctx, mbedtls_operation_t operation,
                               size_t length,
                               const unsigned char data_unit[16],
                               const unsigned char *input,
                               unsigned char *output )
{
    mbedtls_aes_xts_context *xts_ctx = ctx;
    int mode;

    switch( operation )
    {
        case MBEDTLS_ENCRYPT:
            mode = MBEDTLS_AES_ENCRYPT;
            break;
        case MBEDTLS_DECRYPT:
            mode = MBEDTLS_AES_DECRYPT;
            break;
        default:
            return MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA;
    }

    return mbedtls_aes_crypt_xts( xts_ctx, mode, length,
                                  data_unit, input, output );
}